

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_6d04a8::HandleVariableMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  cmMakefile *this;
  cmValue value;
  long *local_48 [2];
  long local_38 [2];
  
  if (name == (string *)0x0) {
    this = status->Makefile;
    value = cmMakefile::GetDefinition(this,propertyName);
    StoreResult<cmValue>(infoType,this,variable,value);
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"given name for VARIABLE scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return name == (string *)0x0;
}

Assistant:

bool HandleVariableMode(cmExecutionStatus& status, const std::string& name,
                        OutType infoType, const std::string& variable,
                        const std::string& propertyName)
{
  if (!name.empty()) {
    status.SetError("given name for VARIABLE scope.");
    return false;
  }

  return StoreResult(infoType, status.GetMakefile(), variable,
                     status.GetMakefile().GetDefinition(propertyName));
}